

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
vkt::ssbo::anon_unknown_0::BlockSingleStructArrayCase::BlockSingleStructArrayCase
          (BlockSingleStructArrayCase *this,TestContext *testCtx,char *name,char *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  StructType *pSVar1;
  BufferBlock *pBVar2;
  VarType local_1d0;
  BufferVar local_1b8;
  VarType local_178;
  VarType local_160;
  BufferVar local_148;
  VarType local_108;
  BufferVar local_f0;
  BufferBlock *local_b0;
  BufferBlock *block;
  VarType local_90;
  VarType local_78;
  VarType local_60;
  StructType *local_38;
  StructType *typeS;
  BufferMode bufferMode_local;
  deUint32 layoutFlags_local;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  BlockSingleStructArrayCase *this_local;
  
  typeS._0_4_ = bufferMode;
  typeS._4_4_ = layoutFlags;
  _bufferMode_local = description;
  description_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,description,bufferMode,matrixLoadFlag);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlockSingleStructArrayCase_016ac800;
  this->m_layoutFlags = typeS._4_4_;
  this->m_numInstances = numInstances;
  pSVar1 = ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"S");
  local_38 = pSVar1;
  glu::VarType::VarType(&local_60,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"a",&local_60);
  glu::VarType::~VarType(&local_60);
  pSVar1 = local_38;
  glu::VarType::VarType(&local_90,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::VarType::VarType(&local_78,&local_90,4);
  glu::StructType::addMember(pSVar1,"b",&local_78);
  glu::VarType::~VarType(&local_78);
  glu::VarType::~VarType(&local_90);
  pSVar1 = local_38;
  glu::VarType::VarType((VarType *)&block,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&block);
  glu::VarType::~VarType((VarType *)&block);
  pBVar2 = ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_b0 = pBVar2;
  glu::VarType::VarType(&local_108,TYPE_UINT,PRECISION_LOWP);
  BufferVar::BufferVar(&local_f0,"u",&local_108,0);
  BufferBlock::addMember(pBVar2,&local_f0);
  BufferVar::~BufferVar(&local_f0);
  glu::VarType::~VarType(&local_108);
  pBVar2 = local_b0;
  glu::VarType::VarType(&local_178,local_38);
  glu::VarType::VarType(&local_160,&local_178,3);
  BufferVar::BufferVar(&local_148,"s",&local_160,0x600);
  BufferBlock::addMember(pBVar2,&local_148);
  BufferVar::~BufferVar(&local_148);
  glu::VarType::~VarType(&local_160);
  glu::VarType::~VarType(&local_178);
  pBVar2 = local_b0;
  glu::VarType::VarType(&local_1d0,TYPE_FLOAT_VEC4,PRECISION_MEDIUMP);
  BufferVar::BufferVar(&local_1b8,"v",&local_1d0,0x400);
  BufferBlock::addMember(pBVar2,&local_1b8);
  BufferVar::~BufferVar(&local_1b8);
  glu::VarType::~VarType(&local_1d0);
  BufferBlock::setFlags(local_b0,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    BufferBlock::setInstanceName(local_b0,"block");
    BufferBlock::setArraySize(local_b0,this->m_numInstances);
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])();
  return;
}

Assistant:

BlockSingleStructArrayCase (tcu::TestContext& testCtx, const char* name, const char* description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
		, m_layoutFlags		(layoutFlags)
		, m_numInstances	(numInstances)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("s", VarType(VarType(&typeS), 3), ACCESS_READ|ACCESS_WRITE));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		init();
	}